

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

bool EV_RotatePoly(line_t_conflict *line,int polyNum,int speed,int byteAngle,int direction,
                  bool overRide)

{
  long lVar1;
  FPolyObj *poly;
  DPolyAction *pDVar2;
  bool bVar3;
  double dVar4;
  FPolyMirrorIterator it;
  FPolyMirrorIterator local_1d0;
  
  lVar1 = (long)po_NumPolyobjs;
  local_1d0.CurPoly = polyobjs;
  if (0 < lVar1) {
    do {
      if ((local_1d0.CurPoly)->tag == polyNum) {
        local_1d0.NumUsedPolys = 1;
        local_1d0.UsedPolys[0] = polyNum;
        poly = FPolyMirrorIterator::NextMirror(&local_1d0);
        if (poly == (FPolyObj *)0x0) {
          return false;
        }
        bVar3 = false;
        goto LAB_0046f03f;
      }
      lVar1 = lVar1 + -1;
      local_1d0.CurPoly = local_1d0.CurPoly + 1;
    } while (lVar1 != 0);
  }
  Printf("EV_RotatePoly: Invalid polyobj num: %d\n");
  return false;
LAB_0046f03f:
  pDVar2 = (poly->specialdata).field_0.p;
  if (pDVar2 == (DPolyAction *)0x0) {
LAB_0046f062:
    if (poly->bBlocked == true && !overRide) {
      return bVar3;
    }
  }
  else {
    if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (poly->specialdata).field_0.p = (DPolyAction *)0x0;
      goto LAB_0046f062;
    }
    if (!overRide) {
      return bVar3;
    }
  }
  if (poly->bHasPortals == '\x02') {
    return bVar3;
  }
  pDVar2 = (DPolyAction *)
           M_Malloc_Dbg(0x58,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                        ,0x1f9);
  DPolyAction::DPolyAction(pDVar2,poly->tag);
  (pDVar2->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006fed38;
  (poly->specialdata).field_0.p = pDVar2;
  poly->bBlocked = false;
  if (byteAngle == 0) {
    dVar4 = 360.0;
  }
  else {
    dVar4 = -1.0;
    if (byteAngle != 0xff) {
      dVar4 = (double)byteAngle * 1.40625;
    }
  }
  pDVar2->m_Dist = dVar4;
  pDVar2->m_Speed = (double)(direction * speed) * 0.17578125;
  SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
  direction = -direction;
  poly = FPolyMirrorIterator::NextMirror(&local_1d0);
  bVar3 = true;
  if (poly == (FPolyObj *)0x0) {
    return true;
  }
  goto LAB_0046f03f;
}

Assistant:

bool EV_RotatePoly (line_t *line, int polyNum, int speed, int byteAngle,
					int direction, bool overRide)
{
	DRotatePoly *pe = NULL;
	FPolyObj *poly;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_RotatePoly: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		if (poly->bHasPortals == 2)
		{
			// cannot do rotations on linked polyportals.
			break;
		}
		pe = new DRotatePoly(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		if (byteAngle != 0)
		{
			if (byteAngle == 255)
			{
				pe->m_Dist = -1.;
			}
			else
			{
				pe->m_Dist =  byteAngle*(90./64); // Angle
			}
		}
		else
		{
			pe->m_Dist = 360.;
		}
		pe->m_Speed = speed*direction*(90./(64<<3));
		SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
		direction = -direction;	// Reverse the direction
	}
	return pe != NULL;	// Return true if something started moving.
}